

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

GLuint __thiscall CMU462::OSDText::compile_shaders(OSDText *this)

{
  PFNGLGETPROGRAMINFOLOGPROC p_Var1;
  PFNGLGETSHADERINFOLOGPROC p_Var2;
  undefined4 uVar3;
  GLuint GVar4;
  int iVar5;
  reference pvVar6;
  allocator_type local_99;
  undefined1 local_98 [8];
  vector<char,_std::allocator<char>_> program_errmsg;
  GLuint program;
  vector<char,_std::allocator<char>_> frag_shader_errmsg;
  allocator_type local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> vert_shader_errmsg;
  int info_length;
  GLint result;
  char *frag_shader_src;
  char *vert_shader_src;
  GLuint frag_shader;
  GLuint vert_shader;
  OSDText *this_local;
  
  _frag_shader = this;
  vert_shader_src._4_4_ = (*__glewCreateShader)(0x8b31);
  vert_shader_src._0_4_ = (*__glewCreateShader)(0x8b30);
  frag_shader_src =
       "#version 120\nattribute vec4 coord;\nvarying vec2 texpos;\nvoid main(void) {\n  gl_Position = vec4(coord.xy, 0, 1);\n  texpos = coord.zw;\n}"
  ;
  _info_length = 
  "#version 120\nvarying vec2 texpos;\nuniform sampler2D tex;\nuniform vec4 color;\nvoid main(void) {\n  gl_FragColor = vec4(1, 1, 1, texture2D(tex, texpos).a) * color;\n}"
  ;
  vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  (*__glewShaderSource)(vert_shader_src._4_4_,1,&frag_shader_src,(GLint *)0x0);
  (*__glewCompileShader)(vert_shader_src._4_4_);
  (*__glewGetShaderiv)
            (vert_shader_src._4_4_,0x8b81,
             (GLint *)&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       field_0x14);
  (*__glewGetShaderiv)
            (vert_shader_src._4_4_,0x8b84,
             (GLint *)&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       field_0x10);
  if (0 < (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
    iVar5 = vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_48,(long)iVar5,&local_49);
    std::allocator<char>::~allocator(&local_49);
    GVar4 = vert_shader_src._4_4_;
    uVar3 = vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    p_Var2 = __glewGetShaderInfoLog;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
    (*p_Var2)(GVar4,uVar3,(GLsizei *)0x0,pvVar6);
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
    printf("%s\n",pvVar6);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_48);
  }
  (*__glewShaderSource)((GLuint)vert_shader_src,1,(GLchar **)&info_length,(GLint *)0x0);
  (*__glewCompileShader)((GLuint)vert_shader_src);
  (*__glewGetShaderiv)
            ((GLuint)vert_shader_src,0x8b81,
             (GLint *)&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       field_0x14);
  (*__glewGetShaderiv)
            ((GLuint)vert_shader_src,0x8b84,
             (GLint *)&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       field_0x10);
  if (0 < (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
    iVar5 = vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&program,(long)iVar5,
               (allocator_type *)
               &program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    GVar4 = (GLuint)vert_shader_src;
    uVar3 = vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    p_Var2 = __glewGetShaderInfoLog;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&program,0);
    (*p_Var2)(GVar4,uVar3,(GLsizei *)0x0,pvVar6);
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&program,0);
    printf("%s\n",pvVar6);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&program);
  }
  program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
       (*__glewCreateProgram)();
  (*__glewAttachShader)
            (program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
             vert_shader_src._4_4_);
  (*__glewAttachShader)
            (program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
             (GLuint)vert_shader_src);
  (*__glewLinkProgram)
            (program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
  (*__glewGetProgramiv)
            (program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,0x8b82,
             (GLint *)&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       field_0x14);
  (*__glewGetProgramiv)
            (program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,0x8b84,
             (GLint *)&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       field_0x10);
  if (0 < (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
    iVar5 = vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_98,(long)iVar5,&local_99);
    std::allocator<char>::~allocator(&local_99);
    uVar3 = program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    p_Var1 = __glewGetProgramInfoLog;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_98,0);
    (*p_Var1)(uVar3,vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    _16_4_,(GLsizei *)0x0,pvVar6);
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_98,0);
    printf("%s\n",pvVar6);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_98);
  }
  (*__glewDetachShader)(1,vert_shader_src._4_4_);
  (*__glewDetachShader)(1,(GLuint)vert_shader_src);
  (*__glewDeleteShader)(vert_shader_src._4_4_);
  (*__glewDeleteShader)((GLuint)vert_shader_src);
  return program_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
}

Assistant:

GLuint OSDText::compile_shaders() {

  // create the shaders
  GLuint vert_shader = glCreateShader(GL_VERTEX_SHADER);
  GLuint frag_shader = glCreateShader(GL_FRAGMENT_SHADER);

  const char *vert_shader_src = "#version 120"
  "\nattribute vec4 coord;"
  "\nvarying vec2 texpos;"
  "\nvoid main(void) {"
  "\n  gl_Position = vec4(coord.xy, 0, 1);"
  "\n  texpos = coord.zw;"
  "\n}";

  const char *frag_shader_src = "#version 120"
  "\nvarying vec2 texpos;"
  "\nuniform sampler2D tex;"
  "\nuniform vec4 color;"
  "\nvoid main(void) {"
  "\n  gl_FragColor = vec4(1, 1, 1, texture2D(tex, texpos).a) * color;"
  "\n}";

// with drop shadow
//  "\nvarying vec2 texpos;"
//  "\nuniform sampler2D tex;"
//  "\nuniform vec4 color;"
//  "\n"
//  "\nconst float smoothing = 1.0/4.0;"
//  "\nconst vec2 shadowOffset = vec2(-1.0/512.0);"
//  "\nconst vec4 glowColor = vec4(vec3(0.1), 1.0);"
//  "\nconst float glowMin = 0.2;"
//  "\nconst float glowMax = 0.8;"
//  "\n"
//  "\n// drop shadow computed in fragment shader"
//  "\nvoid main() {"
//  "\n    vec4 texColor = texture2D(tex, texpos);"
//  "\n    float dst = texColor.a;"
//  "\n    float alpha = smoothstep(0.5 - smoothing, 0.5 + smoothing, dst);"
//  "\n"
//  "\n    float glowDst = texture2D(tex, texpos + shadowOffset).a;"
//  "\n    vec4 glow = glowColor * smoothstep(glowMin, glowMax, glowDst);"
//  "\n"
//  "\n    float mask = 1.0-alpha;"
//  "\n"
//  "\n    vec4 base = color * vec4(vec3(1.0), dst);"
//  "\n    gl_FragColor = mix(base, glow, mask);"
//  "\n}";

  GLint result = GL_FALSE;
  int info_length;

  // compile Vertex Shader
  glShaderSource(vert_shader, 1, &vert_shader_src, NULL);
  glCompileShader(vert_shader);

  // check Vertex Shader
  glGetShaderiv(vert_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(vert_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> vert_shader_errmsg(info_length+1);
    glGetShaderInfoLog(vert_shader, info_length, NULL, &vert_shader_errmsg[0]);
    printf("%s\n", &vert_shader_errmsg[0]);
  }

  // compile Fragment Shader
  glShaderSource(frag_shader, 1, &frag_shader_src, NULL);
  glCompileShader(frag_shader);

  // check Fragment Shader
  glGetShaderiv(frag_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(frag_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> frag_shader_errmsg(info_length+1);
    glGetShaderInfoLog(frag_shader, info_length, NULL, &frag_shader_errmsg[0]);
    printf("%s\n", &frag_shader_errmsg[0]);
  }

  // link the program
  GLuint program = glCreateProgram();
  glAttachShader(program, vert_shader);
  glAttachShader(program, frag_shader);
  glLinkProgram(program);

  // check the program
  glGetProgramiv(program, GL_LINK_STATUS, &result);
  glGetProgramiv(program, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> program_errmsg(info_length+1);
    glGetProgramInfoLog(program, info_length, NULL, &program_errmsg[0]);
    printf("%s\n", &program_errmsg[0]);
  }

  glDetachShader(1, vert_shader);
  glDetachShader(1, frag_shader);
  glDeleteShader(vert_shader);
  glDeleteShader(frag_shader);

  return program;
}